

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int valid_nifti_extensions(nifti_image *nim)

{
  int iVar1;
  uint local_28;
  uint local_24;
  int errs;
  int c;
  nifti1_extension *ext;
  nifti_image *nim_local;
  
  if ((nim->num_ext < 1) || (nim->ext_list == (nifti1_extension *)0x0)) {
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d empty extension list\n");
    }
    nim_local._4_4_ = 0;
  }
  else {
    _errs = nim->ext_list;
    local_28 = 0;
    for (local_24 = 0; (int)local_24 < nim->num_ext; local_24 = local_24 + 1) {
      iVar1 = nifti_is_valid_ecode(_errs->ecode);
      if ((iVar1 == 0) && (1 < g_opts.debug)) {
        fprintf(_stderr,"-d ext %d, unknown code %d\n",(ulong)local_24,(ulong)(uint)_errs->ecode);
      }
      if (_errs->esize < 1) {
        if (1 < g_opts.debug) {
          fprintf(_stderr,"-d ext %d, bad size = %d\n",(ulong)local_24,(ulong)(uint)_errs->esize);
        }
        local_28 = local_28 + 1;
      }
      else if ((_errs->esize & 0xfU) != 0) {
        if (1 < g_opts.debug) {
          fprintf(_stderr,"-d ext %d, size %d not multiple of 16\n",(ulong)local_24,
                  (ulong)(uint)_errs->esize);
        }
        local_28 = local_28 + 1;
      }
      if (_errs->edata == (char *)0x0) {
        if (1 < g_opts.debug) {
          fprintf(_stderr,"-d ext %d, missing data\n",(ulong)local_24);
        }
        local_28 = local_28 + 1;
      }
      _errs = _errs + 1;
    }
    if ((int)local_28 < 1) {
      nim_local._4_4_ = 1;
    }
    else {
      if (0 < g_opts.debug) {
        fprintf(_stderr,"-d had %d extension errors, none will be written\n",(ulong)local_28);
      }
      nim_local._4_4_ = 0;
    }
  }
  return nim_local._4_4_;
}

Assistant:

int valid_nifti_extensions(const nifti_image * nim)
{
   nifti1_extension * ext;
   int                c, errs;

   if( nim->num_ext <= 0 || nim->ext_list == NULL ){
      if( g_opts.debug > 2 ) fprintf(stderr,"-d empty extension list\n");
      return 0;
   }

   /* for each extension, check code, size and data pointer */
   ext = nim->ext_list;
   errs = 0;
   for ( c = 0; c < nim->num_ext; c++ ){
      if( ! nifti_is_valid_ecode(ext->ecode) ) {
         if( g_opts.debug > 1 )
            fprintf(stderr,"-d ext %d, unknown code %d\n", c, ext->ecode);
         /* should not be fatal    29 Apr 2015 [rickr] */
      }

      if( ext->esize <= 0 ){
         if( g_opts.debug > 1 )
            fprintf(stderr,"-d ext %d, bad size = %d\n", c, ext->esize);
         errs++;
      } else if( ext->esize & 0xf ){
         if( g_opts.debug > 1 )
            fprintf(stderr,"-d ext %d, size %d not multiple of 16\n",
                    c, ext->esize);
         errs++;
      }

      if( ext->edata == NULL ){
         if( g_opts.debug > 1 ) fprintf(stderr,"-d ext %d, missing data\n", c);
         errs++;
      }

      ext++;
   }

   if( errs > 0 ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"-d had %d extension errors, none will be written\n",
                 errs);
      return 0;
   }

   /* if we're here, we're good */
   return 1;
}